

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer_type.cpp
# Opt level: O2

OptimizerType duckdb::OptimizerTypeFromString(string *str)

{
  bool bVar1;
  ParserException *this;
  long lVar2;
  long lVar3;
  allocator local_ca;
  allocator local_c9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  optimizer_names;
  string local_a8;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  lVar3 = 0;
  do {
    lVar2 = lVar3;
    if (lVar2 + 0x10 == 0x1c0) {
      optimizer_names.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      optimizer_names.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      optimizer_names.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      for (lVar3 = 0; lVar3 != 0x1b0; lVar3 = lVar3 + 0x10) {
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const*const&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &optimizer_names,(char **)((long)&internal_optimizer_types + lVar3));
      }
      this = (ParserException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_48,"Optimizer type \"%s\" not recognized\n%s",&local_c9);
      ::std::__cxx11::string::string((string *)&local_68,(string *)str);
      ::std::__cxx11::string::string((string *)&local_a8,"Candidate optimizers",&local_ca);
      StringUtil::CandidatesErrorMessage(&local_88,&optimizer_names,(string *)str,&local_a8,5);
      ParserException::ParserException<std::__cxx11::string,std::__cxx11::string>
                (this,&local_48,&local_68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_88);
      __cxa_throw(this,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
    }
    bVar1 = ::std::operator==(*(char **)((long)&internal_optimizer_types + lVar2),str);
    lVar3 = lVar2 + 0x10;
  } while (!bVar1);
  return *(OptimizerType *)((long)&DAT_027a4218 + lVar2);
}

Assistant:

OptimizerType OptimizerTypeFromString(const string &str) {
	for (idx_t i = 0; internal_optimizer_types[i].name; i++) {
		if (internal_optimizer_types[i].name == str) {
			return internal_optimizer_types[i].type;
		}
	}
	// optimizer not found, construct candidate list
	vector<string> optimizer_names;
	for (idx_t i = 0; internal_optimizer_types[i].name; i++) {
		optimizer_names.emplace_back(internal_optimizer_types[i].name);
	}
	throw ParserException("Optimizer type \"%s\" not recognized\n%s", str,
	                      StringUtil::CandidatesErrorMessage(optimizer_names, str, "Candidate optimizers"));
}